

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

coda_ascii_integer_mapping * coda_ascii_integer_mapping_new(char *str,int64_t value)

{
  size_t sVar1;
  char *pcVar2;
  coda_ascii_integer_mapping *mapping;
  int64_t value_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    coda_set_error(-100,"empty string value (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xf6);
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    if (sVar1 < 0x41) {
      str_local = (char *)malloc(0x18);
      if (str_local == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x18,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                       ,0x104);
        str_local = (char *)0x0;
      }
      else {
        str_local[0] = '\0';
        str_local[1] = '\0';
        str_local[2] = '\0';
        str_local[3] = '\0';
        str_local[8] = '\0';
        str_local[9] = '\0';
        str_local[10] = '\0';
        str_local[0xb] = '\0';
        str_local[0xc] = '\0';
        str_local[0xd] = '\0';
        str_local[0xe] = '\0';
        str_local[0xf] = '\0';
        *(int64_t *)(str_local + 0x10) = value;
        pcVar2 = strdup(str);
        *(char **)(str_local + 8) = pcVar2;
        if (*(long *)(str_local + 8) == 0) {
          coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                         ,0x10f);
          free(str_local);
          str_local = (char *)0x0;
        }
        else {
          sVar1 = strlen(str);
          *(int *)str_local = (int)sVar1;
        }
      }
    }
    else {
      sVar1 = strlen(str);
      coda_set_error(-400,"string too large (%ld) for ascii integer mapping",sVar1);
      str_local = (char *)0x0;
    }
  }
  return (coda_ascii_integer_mapping *)str_local;
}

Assistant:

coda_ascii_integer_mapping *coda_ascii_integer_mapping_new(const char *str, int64_t value)
{
    coda_ascii_integer_mapping *mapping;

    if (str == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "empty string value (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (strlen(str) > MAX_ASCII_NUMBER_LENGTH)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "string too large (%ld) for ascii integer mapping",
                       (long)strlen(str));
        return NULL;
    }

    mapping = (coda_ascii_integer_mapping *)malloc(sizeof(coda_ascii_integer_mapping));
    if (mapping == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_ascii_integer_mapping), __FILE__, __LINE__);
        return NULL;
    }
    mapping->length = 0;
    mapping->str = NULL;
    mapping->value = value;

    mapping->str = strdup(str);
    if (mapping->str == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        free(mapping);
        return NULL;
    }
    mapping->length = (int)strlen(str);

    return mapping;
}